

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int add_import(JSParseState *s,JSModuleDef *m,JSAtom param_3,JSAtom import_name)

{
  JSContext *ctx;
  JSImportEntry *pJVar1;
  JSAtomStruct *pJVar2;
  JSClosureVar *pJVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  JSFunctionDef *s_00;
  char *fmt;
  
  if ((param_3 == 0x4d) || (param_3 == 0x3a)) {
    fmt = "invalid import binding";
  }
  else {
    ctx = s->ctx;
    if (param_3 == 0x16) {
      s_00 = s->cur_func;
LAB_0014f287:
      iVar4 = add_closure_var(ctx,s_00,(uint)(import_name == 0x7d),0,m->import_entries_count,param_3
                              ,1,1,JS_VAR_NORMAL);
      if (iVar4 < 0) {
        return -1;
      }
      iVar5 = js_resize_array(ctx,&m->import_entries,0xc,&m->import_entries_size,
                              m->import_entries_count + 1);
      if (iVar5 != 0) {
        return -1;
      }
      iVar5 = m->import_entries_count;
      m->import_entries_count = iVar5 + 1;
      pJVar1 = m->import_entries;
      if (0xd1 < (int)import_name) {
        pJVar2 = ctx->rt->atom_array[import_name];
        (pJVar2->header).ref_count = (pJVar2->header).ref_count + 1;
      }
      pJVar1[iVar5].import_name = import_name;
      pJVar1[iVar5].var_idx = iVar4;
      return 0;
    }
    s_00 = s->cur_func;
    uVar7 = 0;
    uVar6 = (ulong)(uint)s_00->closure_var_count;
    if (s_00->closure_var_count < 1) {
      uVar6 = uVar7;
    }
    do {
      if (uVar6 == uVar7) goto LAB_0014f287;
      pJVar3 = s_00->closure_var + uVar7;
      uVar7 = uVar7 + 1;
    } while (pJVar3->var_name != param_3);
    fmt = "duplicate import binding";
  }
  js_parse_error(s,fmt);
  return -1;
}

Assistant:

static int add_import(JSParseState *s, JSModuleDef *m,
                      JSAtom local_name, JSAtom import_name)
{
    JSContext *ctx = s->ctx;
    int i, var_idx;
    JSImportEntry *mi;
    BOOL is_local;

    if (local_name == JS_ATOM_arguments || local_name == JS_ATOM_eval)
        return js_parse_error(s, "invalid import binding");

    if (local_name != JS_ATOM_default) {
        for (i = 0; i < s->cur_func->closure_var_count; i++) {
            if (s->cur_func->closure_var[i].var_name == local_name)
                return js_parse_error(s, "duplicate import binding");
        }
    }

    is_local = (import_name == JS_ATOM__star_);
    var_idx = add_closure_var(ctx, s->cur_func, is_local, FALSE,
                              m->import_entries_count,
                              local_name, TRUE, TRUE, FALSE);
    if (var_idx < 0)
        return -1;
    if (js_resize_array(ctx, (void **)&m->import_entries,
                        sizeof(JSImportEntry),
                        &m->import_entries_size,
                        m->import_entries_count + 1))
        return -1;
    mi = &m->import_entries[m->import_entries_count++];
    mi->import_name = JS_DupAtom(ctx, import_name);
    mi->var_idx = var_idx;
    return 0;
}